

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SAXParser::parse(SAXParser *this,InputSource *source)

{
  IOException *this_00;
  ResetInProgressType_conflict1 resetInProgress;
  JanitorMemFunCall<xercesc_4_0::SAXParser> local_28;
  
  if (this->fParseInProgress != true) {
    local_28.fToCall = (MFPT)SAXParser::resetInProgress;
    local_28._16_8_ = 0;
    this->fParseInProgress = true;
    local_28.fObject = this;
    (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[7])();
    JanitorMemFunCall<xercesc_4_0::SAXParser>::~JanitorMemFunCall(&local_28);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/SAXParser.cpp"
             ,0x242,Gen_ParseInProgress,this->fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,XMLException::~XMLException);
}

Assistant:

void SAXParser::parse(const InputSource& source)
{
    // Avoid multiple entrance
    if (fParseInProgress)
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetInProgressType     resetInProgress(this, &SAXParser::resetInProgress);

    try
    {
        fParseInProgress = true;
        fScanner->scanDocument(source);
    }
    catch(const OutOfMemoryException&)
    {
        resetInProgress.release();

        throw;
    }
}